

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

string * deqp::gles3::Performance::strWithWhiteSpaceAndComments
                   (string *__return_storage_ptr__,string *str,deUint32 uniqueNumber)

{
  deUint32 dVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int local_10c;
  undefined1 local_108 [4];
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int local_44;
  int i;
  int numWS;
  Random rnd;
  int firstLineEndNdx;
  allocator<char> local_1e;
  byte local_1d;
  deUint32 local_1c;
  string *psStack_18;
  deUint32 uniqueNumber_local;
  string *str_local;
  string *res;
  
  local_1d = 0;
  local_1c = uniqueNumber;
  psStack_18 = str;
  str_local = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1e);
  std::allocator<char>::~allocator(&local_1e);
  rnd.m_rnd.z = 0;
  while( true ) {
    dVar1 = rnd.m_rnd.z;
    iVar2 = std::__cxx11::string::size();
    bVar4 = false;
    if ((int)dVar1 < iVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
      bVar4 = *pcVar3 != '\n';
    }
    if (!bVar4) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
    rnd.m_rnd.z = rnd.m_rnd.z + 1;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  de::Random::Random((Random *)&i,local_1c);
  local_44 = de::Random::getInt((Random *)&i,10,0x14);
  for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
    iVar2 = de::Random::getInt((Random *)&i,0,2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," \t\n"[iVar2]);
  }
  de::toString<unsigned_int>(&local_a8,&local_1c);
  std::operator+(&local_88,"/* unique comment ",&local_a8);
  std::operator+(&local_68,&local_88," */\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  de::toString<unsigned_int>((string *)local_108,&local_1c);
  std::operator+(&local_e8,"// unique comment ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  std::operator+(&local_c8,&local_e8,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  for (local_10c = 0; local_10c < local_44; local_10c = local_10c + 1) {
    iVar2 = de::Random::getInt((Random *)&i,0,2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," \t\n"[iVar2]);
  }
  std::__cxx11::string::c_str();
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_1d = 1;
  de::Random::~Random((Random *)&i);
  if ((local_1d & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static string strWithWhiteSpaceAndComments (const string& str, deUint32 uniqueNumber)
{
	string res("");

	// Find the first newline.
	int firstLineEndNdx = 0;
	while (firstLineEndNdx < (int)str.size() && str[firstLineEndNdx] != '\n')
	{
		res += str[firstLineEndNdx];
		firstLineEndNdx++;
	}
	res += '\n';
	DE_ASSERT(firstLineEndNdx < (int)str.size());

	// Add the whitespaces and comments just after the first line.

	de::Random		rnd		(uniqueNumber);
	int				numWS	= rnd.getInt(10, 20);

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	res += "/* unique comment " + de::toString(uniqueNumber) + " */\n";
	res += "// unique comment " + de::toString(uniqueNumber) + "\n";

	for (int i = 0; i < numWS; i++)
		res += " \t\n"[rnd.getInt(0, 2)];

	// Add the rest of the string.
	res.append(&str.c_str()[firstLineEndNdx + 1]);

	return res;
}